

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

void __thiscall CCharmapToLocal::~CCharmapToLocal(CCharmapToLocal *this)

{
  long lVar1;
  
  (this->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmapToLocal_0034d318;
  if (this->xlat_array_ != (uchar *)0x0) {
    free(this->xlat_array_);
  }
  if (this->exp_array_ != (wchar_t *)0x0) {
    free(this->exp_array_);
  }
  lVar1 = 0;
  do {
    if (this->map_[lVar1] != (uint *)0x0) {
      free(this->map_[lVar1]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  lVar1 = 0;
  do {
    if (this->exp_map_[lVar1] != (uint *)0x0) {
      free(this->exp_map_[lVar1]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

CCharmapToLocal::~CCharmapToLocal()
{
    size_t i;

    /* delete the translation array */
    if (xlat_array_ != 0)
        t3free(xlat_array_);

    /* delete the expansion array */
    if (exp_array_ != 0)
        t3free(exp_array_);

    /* delete any mapping tables we've allocated */
    for (i = 0 ; i < sizeof(map_)/sizeof(map_[0]) ; ++i)
    {
        /* delete this mapping if allocated */
        if (map_[i] != 0)
            t3free(map_[i]);
    }

    /* delete any expansion mapping tables */
    for (i = 0 ; i < sizeof(exp_map_)/sizeof(exp_map_[0]) ; ++i)
    {
        /* delete this expansion mapping if allocated */
        if (exp_map_[i] != 0)
            t3free(exp_map_[i]);
    }
}